

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

CURLcode singleipconnect(connectdata *conn,Curl_addrinfo *ai,curl_socket_t *sockp)

{
  curl_sockopt_callback p_Var1;
  SessionHandle *pSVar2;
  undefined8 uVar3;
  _Bool _Var4;
  CURLcode CVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  if2ip_result_t iVar9;
  size_t sVar10;
  int *piVar11;
  uint *puVar12;
  uint uVar13;
  char *pcVar14;
  char *fmt;
  socklen_t __len;
  SessionHandle *unaff_R12;
  ulong uVar15;
  byte *__s;
  ushort uVar16;
  SessionHandle *pSVar17;
  timeval tVar18;
  curl_socket_t sockfd;
  Curl_dns_entry *h;
  Curl_sockaddr_storage sa;
  long port;
  char ipaddress [46];
  Curl_sockaddr_ex addr;
  int optval;
  uint local_2b8;
  uint local_2b4;
  SessionHandle *local_2b0;
  ulong local_2a8;
  uint local_29c;
  Curl_dns_entry *local_298;
  int local_290;
  socklen_t local_28c;
  sockaddr local_288;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  long local_200;
  char local_1f8 [48];
  undefined1 local_1c8 [144];
  sockaddr local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  
  pSVar17 = conn->data;
  *sockp = -1;
  CVar5 = Curl_socket(conn,ai,(Curl_sockaddr_ex *)local_1c8,(curl_socket_t *)&local_2b8);
  if (CVar5 != CURLE_OK) {
    return CURLE_OK;
  }
  _Var4 = getaddressinfo((sockaddr *)(local_1c8 + 0x10),local_1f8,&local_200);
  if (!_Var4) {
    puVar12 = (uint *)__errno_location();
    uVar13 = *puVar12;
    pcVar14 = Curl_strerror(conn,uVar13);
    Curl_failf(pSVar17,"sa_addr inet_ntop() failed with errno %d: %s",(ulong)uVar13,pcVar14);
    Curl_closesocket(conn,local_2b8);
    return CURLE_OK;
  }
  Curl_infof(pSVar17,"  Trying %s...\n",local_1f8);
  uVar3 = local_138._0_8_;
  uVar13 = local_2b8;
  if ((local_1c8._0_4_ == 2) && (local_1c8._4_4_ == 1)) {
    if ((pSVar17->set).tcp_nodelay == true) {
      unaff_R12 = conn->data;
      local_138._1_3_ = 0;
      local_138.sa_family._0_1_ = (unaff_R12->set).tcp_nodelay;
      local_138.sa_data._2_4_ = SUB84(uVar3,4);
      iVar6 = setsockopt(local_2b8,6,1,&local_138,4);
      if (iVar6 < 0) {
        piVar11 = __errno_location();
        pcVar14 = Curl_strerror(conn,*piVar11);
        Curl_infof(unaff_R12,"Could not set TCP_NODELAY: %s\n",pcVar14);
      }
      else {
        Curl_infof(unaff_R12,"TCP_NODELAY set\n");
      }
    }
    if ((pSVar17->set).tcp_keepalive == true) {
      local_138._0_4_ = 1;
      iVar6 = setsockopt(uVar13,1,9,&local_138,4);
      if (iVar6 < 0) {
        pcVar14 = "Failed to set SO_KEEPALIVE on fd %d\n";
      }
      else {
        iVar6 = curlx_sltosi((pSVar17->set).tcp_keepidle);
        local_138._0_4_ = iVar6;
        iVar6 = setsockopt(uVar13,6,4,&local_138,4);
        if (iVar6 < 0) {
          Curl_infof(pSVar17,"Failed to set TCP_KEEPIDLE on fd %d\n",(ulong)uVar13);
        }
        iVar6 = curlx_sltosi((pSVar17->set).tcp_keepintvl);
        local_138._0_4_ = iVar6;
        iVar6 = setsockopt(uVar13,6,5,&local_138,4);
        if (-1 < iVar6) goto LAB_00109cce;
        pcVar14 = "Failed to set TCP_KEEPINTVL on fd %d\n";
      }
      Curl_infof(pSVar17,pcVar14,(ulong)uVar13);
    }
  }
LAB_00109cce:
  p_Var1 = (pSVar17->set).fsockopt;
  if ((p_Var1 == (curl_sockopt_callback)0x0) ||
     (iVar6 = (*p_Var1)((pSVar17->set).sockopt_client,uVar13,CURLSOCKTYPE_IPCXN), iVar6 == 0)) {
    uVar15 = 0;
  }
  else {
    uVar15 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
    if (iVar6 != 2) {
      Curl_closesocket(conn,uVar13);
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }
  if (local_1c8._0_4_ == 2) {
    local_29c = (uint)uVar15;
    uVar7 = Curl_ipv6_scope((sockaddr *)(local_1c8 + 0x10));
    pSVar2 = conn->data;
    local_298 = (Curl_dns_entry *)0x0;
    uVar16 = (pSVar2->set).localport;
    __s = (byte *)(pSVar2->set).str[5];
    if (uVar16 == 0 && __s == (byte *)0x0) {
LAB_0010a0b4:
      uVar15 = (ulong)local_29c;
      goto LAB_0010a0c1;
    }
    local_2a8 = CONCAT44(local_2a8._4_4_,uVar7);
    local_2b4 = uVar13;
    iVar6 = (pSVar2->set).localportrange;
    local_218 = 0;
    uStack_210 = 0;
    local_228 = 0;
    uStack_220 = 0;
    local_238 = 0;
    uStack_230 = 0;
    local_248 = 0;
    uStack_240 = 0;
    local_258 = 0;
    uStack_250 = 0;
    local_268 = 0;
    uStack_260 = 0;
    local_278 = 0;
    uStack_270 = 0;
    local_288.sa_family = 0;
    local_288.sa_data[0] = '\0';
    local_288.sa_data[1] = '\0';
    local_288.sa_data[2] = '\0';
    local_288.sa_data[3] = '\0';
    local_288.sa_data[4] = '\0';
    local_288.sa_data[5] = '\0';
    local_288.sa_data[6] = '\0';
    local_288.sa_data[7] = '\0';
    local_288.sa_data[8] = '\0';
    local_288.sa_data[9] = '\0';
    local_288.sa_data[10] = '\0';
    local_288.sa_data[0xb] = '\0';
    local_288.sa_data[0xc] = '\0';
    local_288.sa_data[0xd] = '\0';
    local_2b0 = pSVar2;
    if ((__s == (byte *)0x0) || (sVar10 = strlen((char *)__s), 0xfe < sVar10)) {
LAB_00109fd3:
      local_288.sa_data._0_2_ = uVar16 << 8 | uVar16 >> 8;
      local_288.sa_family = 2;
      __len = 0x10;
LAB_00109fec:
      iVar8 = bind(local_2b4,&local_288,__len);
      while (iVar8 < 0) {
        if (iVar6 < 2) {
          puVar12 = (uint *)__errno_location();
          pSVar17 = local_2b0;
          uVar13 = *puVar12;
          (local_2b0->state).os_errno = uVar13;
          pcVar14 = Curl_strerror(conn,uVar13);
          fmt = "bind failed with errno %d: %s";
          goto LAB_0010a1d2;
        }
        Curl_infof(local_2b0,"Bind to local port %hu failed, trying next\n",(ulong)uVar16);
        uVar16 = uVar16 + 1;
        if (local_288.sa_family == 2) {
          local_288.sa_data._0_2_ = uVar16 * 0x100 | uVar16 >> 8;
          local_288.sa_family = 2;
        }
        iVar8 = bind(local_2b4,&local_288,__len);
        iVar6 = iVar6 + -1;
      }
      local_28c = 0x80;
      local_138.sa_family = 0;
      local_138.sa_data[0] = '\0';
      local_138.sa_data[1] = '\0';
      local_138.sa_data[2] = '\0';
      local_138.sa_data[3] = '\0';
      local_138.sa_data[4] = '\0';
      local_138.sa_data[5] = '\0';
      local_138.sa_data[6] = '\0';
      local_138.sa_data[7] = '\0';
      local_138.sa_data[8] = '\0';
      local_138.sa_data[9] = '\0';
      local_138.sa_data[10] = '\0';
      local_138.sa_data[0xb] = '\0';
      local_138.sa_data[0xc] = '\0';
      local_138.sa_data[0xd] = '\0';
      local_128 = 0;
      uStack_120 = 0;
      local_118 = 0;
      uStack_110 = 0;
      local_108 = 0;
      uStack_100 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      local_e8 = 0;
      uStack_e0 = 0;
      local_d8 = 0;
      uStack_d0 = 0;
      local_c8 = 0;
      uStack_c0 = 0;
      iVar6 = getsockname(local_2b4,&local_138,&local_28c);
      if (iVar6 < 0) {
        puVar12 = (uint *)__errno_location();
        pSVar17 = local_2b0;
        uVar13 = *puVar12;
        (local_2b0->state).os_errno = uVar13;
        pcVar14 = Curl_strerror(conn,uVar13);
        fmt = "getsockname() failed with errno %d: %s";
LAB_0010a1d2:
        Curl_failf(pSVar17,fmt,(ulong)uVar13,pcVar14);
LAB_0010a1e4:
        Curl_closesocket(conn,local_2b8);
        return CURLE_INTERFACE_FAILED;
      }
      Curl_infof(local_2b0,"Local port: %hu\n",(ulong)uVar16);
      (conn->bits).bound = true;
      uVar13 = local_2b8;
      goto LAB_0010a0b4;
    }
    memset(&local_138,0,0x100);
    local_290 = *__s - 0x69;
    if ((local_290 == 0) && (local_290 = __s[1] - 0x66, local_290 == 0)) {
      local_290 = 0x21 - (uint)__s[2];
    }
    else {
      local_290 = -local_290;
    }
    if (local_290 != 0) {
      iVar8 = strncmp("host!",(char *)__s,5);
      if (iVar8 != 0) goto LAB_00109e22;
      __s = __s + 5;
      goto LAB_00109f1b;
    }
    __s = __s + 3;
LAB_00109e22:
    iVar9 = Curl_if2ip(2,(uint)local_2a8,conn->scope_id,(char *)__s,(char *)&local_138,0x100);
    if (iVar9 == IF2IP_FOUND) {
      Curl_infof(local_2b0,"Local Interface %s is ip %s using address family %i\n",__s,&local_138,2)
      ;
      sVar10 = strlen((char *)__s);
      iVar8 = setsockopt(local_2b4,1,0x19,__s,(int)sVar10 + 1);
      if (iVar8 != 0) {
        piVar11 = __errno_location();
        local_2a8 = CONCAT44(local_2a8._4_4_,*piVar11);
        pcVar14 = Curl_strerror(conn,*piVar11);
        Curl_infof(local_2b0,"SO_BINDTODEVICE %s failed with errno %d: %s; will do regular bind\n",
                   __s,local_2a8 & 0xffffffff,pcVar14);
      }
LAB_00109fb4:
      iVar8 = inet_pton(2,(char *)&local_138,local_288.sa_data + 2);
      if (0 < iVar8) goto LAB_00109fd3;
      __len = 0;
      goto LAB_00109fec;
    }
    uVar13 = local_2b4;
    if (iVar9 != IF2IP_AF_NOT_SUPPORTED) {
      if (iVar9 == IF2IP_NOT_FOUND) {
        if (local_290 == 0) {
          Curl_failf(local_2b0,"Couldn\'t bind to interface \'%s\'",__s);
          local_2b8 = local_2b4;
          goto LAB_0010a1e4;
        }
LAB_00109f1b:
        local_2a8 = conn->ip_version;
        conn->ip_version = 1;
        Curl_resolv(conn,(char *)__s,0,&local_298);
        conn->ip_version = local_2a8;
        if (local_298 != (Curl_dns_entry *)0x0) {
          Curl_printable_address(local_298->addr,(char *)&local_138,0x100);
          Curl_infof(local_2b0,"Name \'%s\' family %i resolved to \'%s\' family %i\n",__s,2,
                     &local_138,(ulong)(uint)local_298->addr->ai_family);
          Curl_resolv_unlock(local_2b0,local_298);
          goto LAB_00109fb4;
        }
      }
      else if (local_290 != 0) goto LAB_00109f1b;
      Curl_failf(local_2b0,"Couldn\'t bind to \'%s\'",__s);
      goto LAB_0010a1e4;
    }
LAB_0010a17c:
    Curl_closesocket(conn,uVar13);
    CVar5 = CURLE_COULDNT_CONNECT;
  }
  else {
LAB_0010a0c1:
    curlx_nonblock(uVar13,1);
    tVar18 = curlx_tvnow();
    conn->connecttime = tVar18;
    if (1 < conn->num_addr) {
      Curl_expire_latest(pSVar17,conn->timeoutms_per_addr);
    }
    if ((((char)uVar15 == '\0') && (conn->socktype == 1)) &&
       (iVar6 = connect(uVar13,(sockaddr *)(local_1c8 + 0x10),local_1c8._12_4_), iVar6 == -1)) {
      piVar11 = __errno_location();
      iVar6 = *piVar11;
      if ((iVar6 != 0xb) && (iVar6 != 0x73)) {
        pcVar14 = Curl_strerror(conn,iVar6);
        Curl_infof(pSVar17,"Immediate connect fail for %s: %s\n",local_1f8,pcVar14);
        (pSVar17->state).os_errno = iVar6;
        goto LAB_0010a17c;
      }
    }
    *sockp = uVar13;
    CVar5 = CURLE_OK;
  }
  return CVar5;
}

Assistant:

static CURLcode singleipconnect(struct connectdata *conn,
                                const Curl_addrinfo *ai,
                                curl_socket_t *sockp)
{
  struct Curl_sockaddr_ex addr;
  int rc;
  int error = 0;
  bool isconnected = FALSE;
  struct SessionHandle *data = conn->data;
  curl_socket_t sockfd;
  CURLcode result;
  char ipaddress[MAX_IPADR_LEN];
  long port;
  bool is_tcp;

  *sockp = CURL_SOCKET_BAD;

  result = Curl_socket(conn, ai, &addr, &sockfd);
  if(result)
    /* Failed to create the socket, but still return OK since we signal the
       lack of socket as well. This allows the parent function to keep looping
       over alternative addresses/socket families etc. */
    return CURLE_OK;

  /* store remote address and port used in this connection attempt */
  if(!getaddressinfo((struct sockaddr*)&addr.sa_addr,
                     ipaddress, &port)) {
    /* malformed address or bug in inet_ntop, try next address */
    error = ERRNO;
    failf(data, "sa_addr inet_ntop() failed with errno %d: %s",
          error, Curl_strerror(conn, error));
    Curl_closesocket(conn, sockfd);
    return CURLE_OK;
  }
  infof(data, "  Trying %s...\n", ipaddress);

#ifdef ENABLE_IPV6
  is_tcp = (addr.family == AF_INET || addr.family == AF_INET6) &&
    addr.socktype == SOCK_STREAM;
#else
  is_tcp = (addr.family == AF_INET) && addr.socktype == SOCK_STREAM;
#endif
  if(is_tcp && data->set.tcp_nodelay)
    tcpnodelay(conn, sockfd);

  nosigpipe(conn, sockfd);

  Curl_sndbufset(sockfd);

  if(is_tcp && data->set.tcp_keepalive)
    tcpkeepalive(data, sockfd);

  if(data->set.fsockopt) {
    /* activate callback for setting socket options */
    error = data->set.fsockopt(data->set.sockopt_client,
                               sockfd,
                               CURLSOCKTYPE_IPCXN);

    if(error == CURL_SOCKOPT_ALREADY_CONNECTED)
      isconnected = TRUE;
    else if(error) {
      Curl_closesocket(conn, sockfd); /* close the socket and bail out */
      return CURLE_ABORTED_BY_CALLBACK;
    }
  }

  /* possibly bind the local end to an IP, interface or port */
  if(addr.family == AF_INET
#ifdef ENABLE_IPV6
     || addr.family == AF_INET6
#endif
    ) {
    result = bindlocal(conn, sockfd, addr.family,
                       Curl_ipv6_scope((struct sockaddr*)&addr.sa_addr));
    if(result) {
      Curl_closesocket(conn, sockfd); /* close socket and bail out */
      if(result == CURLE_UNSUPPORTED_PROTOCOL) {
        /* The address family is not supported on this interface.
           We can continue trying addresses */
        return CURLE_COULDNT_CONNECT;
      }
      return result;
    }
  }

  /* set socket non-blocking */
  (void)curlx_nonblock(sockfd, TRUE);

  conn->connecttime = Curl_tvnow();
  if(conn->num_addr > 1)
    Curl_expire_latest(data, conn->timeoutms_per_addr);

  /* Connect TCP sockets, bind UDP */
  if(!isconnected && (conn->socktype == SOCK_STREAM)) {
    rc = connect(sockfd, &addr.sa_addr, addr.addrlen);
    if(-1 == rc)
      error = SOCKERRNO;
  }
  else {
    *sockp = sockfd;
    return CURLE_OK;
  }

#ifdef ENABLE_IPV6
  conn->bits.ipv6 = (addr.family == AF_INET6)?TRUE:FALSE;
#endif

  if(-1 == rc) {
    switch(error) {
    case EINPROGRESS:
    case EWOULDBLOCK:
#if defined(EAGAIN)
#if (EAGAIN) != (EWOULDBLOCK)
      /* On some platforms EAGAIN and EWOULDBLOCK are the
       * same value, and on others they are different, hence
       * the odd #if
       */
    case EAGAIN:
#endif
#endif
      result = CURLE_OK;
      break;

    default:
      /* unknown error, fallthrough and try another address! */
      infof(data, "Immediate connect fail for %s: %s\n",
            ipaddress, Curl_strerror(conn, error));
      data->state.os_errno = error;

      /* connect failed */
      Curl_closesocket(conn, sockfd);
      result = CURLE_COULDNT_CONNECT;
    }
  }

  if(!result)
    *sockp = sockfd;

  return result;
}